

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QRect __thiscall QWidget::childrenRect(QWidget *this)

{
  long lVar1;
  QRect QVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  local_38.x1.m_i = 0;
  local_38.y1.m_i = 0;
  local_38.x2.m_i = -1;
  local_38.y2.m_i = -1;
  if (*(long *)(lVar1 + 0x28) != 0) {
    uVar4 = 0;
    do {
      lVar3 = *(long *)(*(long *)(lVar1 + 0x20) + uVar4 * 8);
      if ((lVar3 == 0) || ((*(byte *)(*(long *)(lVar3 + 8) + 0x30) & 1) == 0)) {
        lVar3 = 0;
      }
      if (((lVar3 != 0) && (lVar3 = *(long *)(lVar3 + 0x20), (*(byte *)(lVar3 + 0xc) & 1) == 0)) &&
         ((*(byte *)(lVar3 + 10) & 1) == 0)) {
        auVar5 = QRect::operator|(&local_38,(QRect *)(lVar3 + 0x14));
        local_38.x1.m_i = auVar5._0_4_;
        local_38.y1.m_i = auVar5._4_4_;
        local_38.x2.m_i = auVar5._8_4_;
        local_38.y2.m_i = auVar5._12_4_;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)(lVar1 + 0x28));
  }
  QVar2.y1.m_i = local_38.y1.m_i;
  QVar2.x1.m_i = local_38.x1.m_i;
  QVar2.x2.m_i = local_38.x2.m_i;
  QVar2.y2.m_i = local_38.y2.m_i;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QWidget::childrenRect() const
{
    Q_D(const QWidget);
    QRect r(0, 0, 0, 0);
    for (int i = 0; i < d->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
        if (w && !w->isWindow() && !w->isHidden())
            r |= w->geometry();
    }
    return r;
}